

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O3

void ExportSkin(Asset *mAsset,aiMesh *aimesh,Ref<glTF2::Mesh> *meshRef,Ref<glTF2::Buffer> *bufferRef
               ,Ref<glTF2::Skin> *skinRef,
               vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
               *inverseBindMatricesData)

{
  pointer *ppRVar1;
  pointer *ppRVar2;
  aiBone *paVar3;
  iterator __position;
  aiVertexWeight *paVar4;
  pointer pPVar5;
  Accessor *pAVar6;
  size_t __n;
  long *plVar7;
  iterator iVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  int iVar11;
  void *pvVar12;
  void *__s;
  void *pvVar13;
  Ref<glTF2::Node> *pRVar14;
  LazyDict<glTF2::Node> *pLVar15;
  void *__src;
  void *__dest;
  float fVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  iterator __position_00;
  Skin *pSVar21;
  long lVar22;
  Asset *a;
  uint uVar23;
  pointer paVar24;
  Ref<glTF2::Buffer> *buffer;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  Ref<glTF2::Node> RVar30;
  Ref<glTF2::Accessor> RVar31;
  Ref<glTF2::Accessor> vertexWeightAccessor;
  Ref<glTF2::Accessor> vertexJointAccessor;
  Ref<glTF2::Accessor> local_c8;
  Asset *local_b8;
  Ref<glTF2::Buffer> *local_b0;
  LazyDict<glTF2::Node> *local_a8;
  aiMesh *local_a0;
  void *local_98;
  ulong local_90;
  __shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *local_88;
  long local_80;
  aiMatrix4x4t<float> local_78;
  
  if (aimesh->mNumBones != 0) {
    uVar17 = (ulong)aimesh->mNumVertices;
    uVar20 = uVar17 << 4;
    local_b0 = bufferRef;
    local_a0 = aimesh;
    pvVar12 = operator_new__(uVar20);
    __s = operator_new__(uVar20);
    pvVar13 = operator_new__(uVar17 * 4);
    if (uVar17 != 0) {
      uVar18 = 0;
      memset(pvVar12,0,uVar20);
      memset(__s,0,uVar20);
      auVar10 = _DAT_0067b690;
      lVar22 = uVar17 - 1;
      auVar25._8_4_ = (int)lVar22;
      auVar25._0_8_ = lVar22;
      auVar25._12_4_ = (int)((ulong)lVar22 >> 0x20);
      auVar25 = auVar25 ^ _DAT_0067b690;
      auVar26 = _DAT_0067cac0;
      auVar27 = _DAT_0067cad0;
      do {
        auVar28 = auVar27 ^ auVar10;
        iVar11 = auVar25._4_4_;
        if ((bool)(~(auVar28._4_4_ == iVar11 && auVar25._0_4_ < auVar28._0_4_ ||
                    iVar11 < auVar28._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar13 + uVar18) = 0;
        }
        if ((auVar28._12_4_ != auVar25._12_4_ || auVar28._8_4_ <= auVar25._8_4_) &&
            auVar28._12_4_ <= auVar25._12_4_) {
          *(undefined4 *)((long)pvVar13 + uVar18 + 4) = 0;
        }
        auVar28 = auVar26 ^ auVar10;
        iVar29 = auVar28._4_4_;
        if (iVar29 <= iVar11 && (iVar29 != iVar11 || auVar28._0_4_ <= auVar25._0_4_)) {
          *(undefined4 *)((long)pvVar13 + uVar18 + 8) = 0;
          *(undefined4 *)((long)pvVar13 + uVar18 + 0xc) = 0;
        }
        lVar22 = auVar27._8_8_;
        auVar27._0_8_ = auVar27._0_8_ + 4;
        auVar27._8_8_ = lVar22 + 4;
        lVar22 = auVar26._8_8_;
        auVar26._0_8_ = auVar26._0_8_ + 4;
        auVar26._8_8_ = lVar22 + 4;
        uVar18 = uVar18 + 0x10;
      } while ((uVar17 * 4 + 0xc & 0xfffffffffffffff0) != uVar18);
    }
    local_a8 = &mAsset->nodes;
    uVar20 = 0;
    local_b8 = mAsset;
    local_98 = pvVar12;
    do {
      paVar3 = local_a0->mBones[uVar20];
      RVar30 = glTF2::LazyDict<glTF2::Node>::Get(local_a8,(paVar3->mName).data);
      local_c8.vector =
           (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)RVar30.vector;
      local_c8.index = RVar30.index;
      std::__cxx11::string::_M_assign
                ((string *)
                 &(((_Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)
                   &(local_c8.vector)->
                    super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)->
                  _M_impl).super__Vector_impl_data._M_start[local_c8.index]->jointName);
      pSVar21 = (skinRef->vector->super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)
                ._M_impl.super__Vector_impl_data._M_start[skinRef->index];
      pRVar14 = *(Ref<glTF2::Node> **)
                 &(pSVar21->jointNames).
                  super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                  ._M_impl;
      __position_00._M_current =
           *(pointer *)
            ((long)&(pSVar21->jointNames).
                    super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
            + 8);
      if (__position_00._M_current == pRVar14) {
LAB_00380dff:
        if (__position_00._M_current ==
            *(pointer *)
             ((long)&(pSVar21->jointNames).
                     super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
             + 0x10)) {
          std::vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>>::
          _M_realloc_insert<glTF2::Ref<glTF2::Node>const&>
                    ((vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>> *)
                     &pSVar21->jointNames,__position_00,(Ref<glTF2::Node> *)&local_c8);
        }
        else {
          (__position_00._M_current)->vector =
               (vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)local_c8.vector;
          *(ulong *)&(__position_00._M_current)->index = CONCAT44(local_c8._12_4_,local_c8.index);
          ppRVar2 = (pointer *)
                    ((long)&(pSVar21->jointNames).
                            super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                    + 8);
          *ppRVar2 = *ppRVar2 + 1;
        }
        local_78._0_8_ = *(undefined8 *)&paVar3->mOffsetMatrix;
        local_78.a3 = (paVar3->mOffsetMatrix).a3;
        local_78.a4 = (paVar3->mOffsetMatrix).a4;
        local_78.b1 = (paVar3->mOffsetMatrix).b1;
        local_78.b2 = (paVar3->mOffsetMatrix).b2;
        local_78.b3 = (paVar3->mOffsetMatrix).b3;
        local_78.b4 = (paVar3->mOffsetMatrix).b4;
        local_78.c1 = (paVar3->mOffsetMatrix).c1;
        local_78.c2 = (paVar3->mOffsetMatrix).c2;
        local_78.c3 = (paVar3->mOffsetMatrix).c3;
        local_78.c4 = (paVar3->mOffsetMatrix).c4;
        local_78.d1 = (paVar3->mOffsetMatrix).d1;
        local_78.d2 = (paVar3->mOffsetMatrix).d2;
        local_78.d3 = (paVar3->mOffsetMatrix).d3;
        local_78.d4 = (paVar3->mOffsetMatrix).d4;
        __position._M_current =
             (inverseBindMatricesData->
             super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>)._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (inverseBindMatricesData->
            super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>>::
          _M_realloc_insert<aiMatrix4x4t<float>const&>
                    ((vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>> *)
                     inverseBindMatricesData,__position,&local_78);
          paVar24 = (inverseBindMatricesData->
                    super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (__position._M_current)->d1 = local_78.d1;
          (__position._M_current)->d2 = local_78.d2;
          (__position._M_current)->d3 = local_78.d3;
          (__position._M_current)->d4 = local_78.d4;
          (__position._M_current)->c1 = local_78.c1;
          (__position._M_current)->c2 = local_78.c2;
          (__position._M_current)->c3 = local_78.c3;
          (__position._M_current)->c4 = local_78.c4;
          (__position._M_current)->b1 = local_78.b1;
          (__position._M_current)->b2 = local_78.b2;
          (__position._M_current)->b3 = local_78.b3;
          (__position._M_current)->b4 = local_78.b4;
          *(undefined8 *)__position._M_current = local_78._0_8_;
          (__position._M_current)->a3 = local_78.a3;
          (__position._M_current)->a4 = local_78.a4;
          paVar24 = (inverseBindMatricesData->
                    super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish + 1;
          (inverseBindMatricesData->
          super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>)._M_impl.
          super__Vector_impl_data._M_finish = paVar24;
        }
        uVar23 = (int)((ulong)((long)paVar24 -
                              (long)(inverseBindMatricesData->
                                    super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 6) - 1;
      }
      else {
        bVar9 = true;
        uVar17 = 0;
        uVar19 = 1;
        uVar23 = 0;
        do {
          iVar11 = std::__cxx11::string::compare
                             ((string *)
                              &((pRVar14[uVar17].vector)->
                               super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>).
                               _M_impl.super__Vector_impl_data._M_start[pRVar14[uVar17].index]->
                               jointName);
          if (iVar11 == 0) {
            uVar23 = uVar19 - 1;
          }
          bVar9 = (bool)(bVar9 & iVar11 != 0);
          uVar17 = (ulong)uVar19;
          pSVar21 = (skinRef->vector->
                    super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[skinRef->index];
          pRVar14 = *(Ref<glTF2::Node> **)
                     &(pSVar21->jointNames).
                      super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                      ._M_impl;
          __position_00._M_current =
               *(pointer *)
                ((long)&(pSVar21->jointNames).
                        super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                + 8);
          uVar19 = uVar19 + 1;
        } while (uVar17 < (ulong)((long)__position_00._M_current - (long)pRVar14 >> 4));
        pvVar12 = local_98;
        if (bVar9) goto LAB_00380dff;
      }
      buffer = local_b0;
      a = local_b8;
      uVar19 = paVar3->mNumWeights;
      if ((ulong)uVar19 != 0) {
        paVar4 = paVar3->mWeights;
        uVar17 = 0;
        do {
          uVar18 = (ulong)paVar4[uVar17].mVertexId;
          iVar11 = *(int *)((long)pvVar13 + uVar18 * 4);
          lVar22 = (long)iVar11;
          if (lVar22 < 4) {
            fVar16 = paVar4[uVar17].mWeight;
            *(float *)((long)pvVar12 + lVar22 * 4 + uVar18 * 0x10) = (float)uVar23;
            *(float *)((long)__s + lVar22 * 4 + uVar18 * 0x10) = fVar16;
            *(int *)((long)pvVar13 + uVar18 * 4) = iVar11 + 1;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < uVar19);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < local_a0->mNumBones);
    pPVar5 = *(pointer *)
              ((long)&((meshRef->vector->
                       super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[meshRef->index]->primitives).
                      super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
              + 8);
    RVar31 = ExportData(local_b8,&((skinRef->vector->
                                   super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[skinRef->index]->
                                  super_Object).id,local_b0,(ulong)local_a0->mNumVertices,pvVar12,
                        VEC4,VEC4,ComponentType_FLOAT,false);
    pLVar15 = (LazyDict<glTF2::Node> *)RVar31.vector;
    fVar16 = (float)RVar31.index;
    local_78.a3 = fVar16;
    local_78._0_8_ = pLVar15;
    if (pLVar15 != (LazyDict<glTF2::Node> *)0x0) {
      pAVar6 = (((_Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)
                &pLVar15->super_LazyDictBase)->_M_impl).super__Vector_impl_data._M_start
               [(uint)fVar16];
      lVar22 = *(long *)(*(long *)&(((pAVar6->bufferView).vector)->
                                   super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                                   )._M_impl + (ulong)(pAVar6->bufferView).index * 8);
      __n = *(size_t *)(lVar22 + 0x60);
      uVar20 = *(ulong *)(lVar22 + 0x68);
      uVar19 = glTF2::ComponentTypeSize(pAVar6->componentType);
      pAVar6 = (((_Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)
                &pLVar15->super_LazyDictBase)->_M_impl).super__Vector_impl_data._M_start
               [(uint)fVar16];
      lVar22 = *(long *)(*(long *)&(((pAVar6->bufferView).vector)->
                                   super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                                   )._M_impl + (ulong)(pAVar6->bufferView).index * 8);
      plVar7 = *(long **)(lVar22 + 0x50);
      uVar23 = *(uint *)(lVar22 + 0x58);
      local_a8 = pLVar15;
      __src = operator_new__(uVar20);
      lVar22 = *(long *)(*plVar7 + (ulong)uVar23 * 8);
      pvVar12 = *(void **)(lVar22 + 0x70);
      uVar18 = 0;
      uVar17 = 0;
      uVar23 = uVar19;
      do {
        *(short *)((long)__src + uVar18) = (short)(int)*(float *)((long)pvVar12 + uVar17 + __n);
        uVar17 = (ulong)uVar23;
        uVar23 = uVar23 + uVar19;
        uVar18 = (ulong)((int)uVar18 + 2);
      } while (uVar17 <= uVar20);
      if (uVar20 != 0) {
        local_90 = *(ulong *)(lVar22 + 0x50);
        local_88 = (__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)(lVar22 + 0x70);
        local_80 = lVar22;
        __dest = operator_new__(local_90);
        memcpy(__dest,pvVar12,__n);
        memcpy((void *)(__n + (long)__dest),__src,uVar20);
        uVar17 = local_90;
        memcpy((void *)(__n + uVar20 + (long)__dest),(void *)((long)pvVar12 + uVar20 + __n),
               local_90 - (__n + uVar20));
        std::__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2>::
        reset<unsigned_char,std::default_delete<unsigned_char[]>>(local_88,__dest);
        *(ulong *)(local_80 + 0x50) = uVar17;
      }
      pvVar12 = local_98;
      (((_Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)
       &local_a8->super_LazyDictBase)->_M_impl).super__Vector_impl_data._M_start[(uint)fVar16]->
      componentType = ComponentType_UNSIGNED_SHORT;
      pAVar6 = (((_Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)
                &local_a8->super_LazyDictBase)->_M_impl).super__Vector_impl_data._M_start
               [(uint)fVar16];
      *(ulong *)(*(long *)(*(long *)&(((pAVar6->bufferView).vector)->
                                     super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                                     )._M_impl + (ulong)(pAVar6->bufferView).index * 8) + 0x68) =
           (uVar20 * 2) / (ulong)uVar19;
      iVar8._M_current = *(pointer *)((long)&pPVar5[-1].attributes.joint + 8);
      if (iVar8._M_current == *(pointer *)((long)&pPVar5[-1].attributes.joint + 0x10)) {
        std::vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>::
        _M_realloc_insert<glTF2::Ref<glTF2::Accessor>const&>
                  ((vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>
                    *)&pPVar5[-1].attributes.joint,iVar8,(Ref<glTF2::Accessor> *)&local_78);
      }
      else {
        (iVar8._M_current)->vector =
             (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)local_78._0_8_;
        (iVar8._M_current)->index = (uint)local_78.a3;
        *(float *)&(iVar8._M_current)->field_0xc = local_78.a4;
        ppRVar1 = (pointer *)((long)&pPVar5[-1].attributes.joint + 8);
        *ppRVar1 = *ppRVar1 + 1;
      }
      buffer = local_b0;
      a = local_b8;
      operator_delete__(__src);
    }
    RVar31 = ExportData(a,&((skinRef->vector->
                            super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>).
                            _M_impl.super__Vector_impl_data._M_start[skinRef->index]->super_Object).
                           id,buffer,(ulong)local_a0->mNumVertices,__s,VEC4,VEC4,ComponentType_FLOAT
                        ,false);
    local_c8.vector = RVar31.vector;
    local_c8.index = RVar31.index;
    if (local_c8.vector != (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
      iVar8._M_current = *(pointer *)((long)&pPVar5[-1].attributes.weight + 8);
      if (iVar8._M_current == *(pointer *)((long)&pPVar5[-1].attributes.weight + 0x10)) {
        std::vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>::
        _M_realloc_insert<glTF2::Ref<glTF2::Accessor>const&>
                  ((vector<glTF2::Ref<glTF2::Accessor>,std::allocator<glTF2::Ref<glTF2::Accessor>>>
                    *)&pPVar5[-1].attributes.weight,iVar8,&local_c8);
      }
      else {
        (iVar8._M_current)->vector = local_c8.vector;
        *(ulong *)&(iVar8._M_current)->index = CONCAT44(local_c8._12_4_,local_c8.index);
        ppRVar1 = (pointer *)((long)&pPVar5[-1].attributes.weight + 8);
        *ppRVar1 = *ppRVar1 + 1;
      }
    }
    operator_delete__(pvVar13);
    operator_delete__(__s);
    operator_delete__(pvVar12);
  }
  return;
}

Assistant:

void ExportSkin(Asset& mAsset, const aiMesh* aimesh, Ref<Mesh>& meshRef, Ref<Buffer>& bufferRef, Ref<Skin>& skinRef, std::vector<aiMatrix4x4>& inverseBindMatricesData)
{
    if (aimesh->mNumBones < 1) {
        return;
    }

    // Store the vertex joint and weight data.
    const size_t NumVerts( aimesh->mNumVertices );
    vec4* vertexJointData = new vec4[ NumVerts ];
    vec4* vertexWeightData = new vec4[ NumVerts ];
    int* jointsPerVertex = new int[ NumVerts ];
    for (size_t i = 0; i < NumVerts; ++i) {
        jointsPerVertex[i] = 0;
        for (size_t j = 0; j < 4; ++j) {
            vertexJointData[i][j] = 0;
            vertexWeightData[i][j] = 0;
        }
    }

    for (unsigned int idx_bone = 0; idx_bone < aimesh->mNumBones; ++idx_bone) {
        const aiBone* aib = aimesh->mBones[idx_bone];

        // aib->mName   =====>  skinRef->jointNames
        // Find the node with id = mName.
        Ref<Node> nodeRef = mAsset.nodes.Get(aib->mName.C_Str());
        nodeRef->jointName = nodeRef->name;

        unsigned int jointNamesIndex = 0;
        bool addJointToJointNames = true;
        for ( unsigned int idx_joint = 0; idx_joint < skinRef->jointNames.size(); ++idx_joint) {
            if (skinRef->jointNames[idx_joint]->jointName.compare(nodeRef->jointName) == 0) {
                addJointToJointNames = false;
                jointNamesIndex = idx_joint;
            }
        }

        if (addJointToJointNames) {
            skinRef->jointNames.push_back(nodeRef);

            // aib->mOffsetMatrix   =====>  skinRef->inverseBindMatrices
            aiMatrix4x4 tmpMatrix4;
            CopyValue(aib->mOffsetMatrix, tmpMatrix4);
            inverseBindMatricesData.push_back(tmpMatrix4);
            jointNamesIndex = static_cast<unsigned int>(inverseBindMatricesData.size() - 1);
        }

        // aib->mWeights   =====>  vertexWeightData
        for (unsigned int idx_weights = 0; idx_weights < aib->mNumWeights; ++idx_weights) {
            unsigned int vertexId = aib->mWeights[idx_weights].mVertexId;
            float vertWeight      = aib->mWeights[idx_weights].mWeight;

            // A vertex can only have at most four joint weights. Ignore all others.
            if (jointsPerVertex[vertexId] > 3) {
                continue;
            }

            vertexJointData[vertexId][jointsPerVertex[vertexId]] = static_cast<float>(jointNamesIndex);
            vertexWeightData[vertexId][jointsPerVertex[vertexId]] = vertWeight;

            jointsPerVertex[vertexId] += 1;
        }

    } // End: for-loop mNumMeshes

    Mesh::Primitive& p = meshRef->primitives.back();
    Ref<Accessor> vertexJointAccessor = ExportData(mAsset, skinRef->id, bufferRef, aimesh->mNumVertices, vertexJointData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    if ( vertexJointAccessor ) {
        size_t offset = vertexJointAccessor->bufferView->byteOffset;
        size_t bytesLen = vertexJointAccessor->bufferView->byteLength;
        unsigned int s_bytesPerComp= ComponentTypeSize(ComponentType_UNSIGNED_SHORT);
        unsigned int bytesPerComp = ComponentTypeSize(vertexJointAccessor->componentType);
        size_t s_bytesLen = bytesLen * s_bytesPerComp / bytesPerComp;
        Ref<Buffer> buf = vertexJointAccessor->bufferView->buffer;
        uint8_t* arrys = new uint8_t[bytesLen];
        unsigned int i = 0;
        for ( unsigned int j = 0; j <= bytesLen; j += bytesPerComp ){
            size_t len_p = offset + j;
            float f_value = *(float *)&buf->GetPointer()[len_p];
            unsigned short c = static_cast<unsigned short>(f_value);
            memcpy(&arrys[i*s_bytesPerComp], &c, s_bytesPerComp);
            ++i;
        }
        buf->ReplaceData_joint(offset, bytesLen, arrys, bytesLen);
        vertexJointAccessor->componentType = ComponentType_UNSIGNED_SHORT;
        vertexJointAccessor->bufferView->byteLength = s_bytesLen;

        p.attributes.joint.push_back( vertexJointAccessor );
        delete[] arrys;
    }

    Ref<Accessor> vertexWeightAccessor = ExportData(mAsset, skinRef->id, bufferRef, aimesh->mNumVertices,
            vertexWeightData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    if ( vertexWeightAccessor ) {
        p.attributes.weight.push_back( vertexWeightAccessor );
    }
    delete[] jointsPerVertex;
    delete[] vertexWeightData;
    delete[] vertexJointData;
}